

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezeReliablePdu.cpp
# Opt level: O1

void __thiscall
DIS::StopFreezeReliablePdu::marshal(StopFreezeReliablePdu *this,DataStream *dataStream)

{
  SimulationManagementWithReliabilityFamilyPdu::marshal
            (&this->super_SimulationManagementWithReliabilityFamilyPdu,dataStream);
  ClockTime::marshal(&this->_realWorldTime,dataStream);
  DataStream::operator<<(dataStream,this->_reason);
  DataStream::operator<<(dataStream,this->_frozenBehavior);
  DataStream::operator<<(dataStream,this->_requiredReliablityService);
  DataStream::operator<<(dataStream,this->_pad1);
  DataStream::operator<<(dataStream,this->_requestID);
  return;
}

Assistant:

void StopFreezeReliablePdu::marshal(DataStream& dataStream) const
{
    SimulationManagementWithReliabilityFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _realWorldTime.marshal(dataStream);
    dataStream << _reason;
    dataStream << _frozenBehavior;
    dataStream << _requiredReliablityService;
    dataStream << _pad1;
    dataStream << _requestID;
}